

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

int __thiscall asl::File::open(File *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  undefined8 extraout_RAX;
  ulong uVar4;
  ulong uVar5;
  char *__filename;
  char *b;
  char fopen_mode [8];
  char local_20 [8];
  
  b = __file + 8;
  __filename = b;
  if (*(int *)__file != 0) {
    __filename = *(char **)(__file + 8);
  }
  if (*__filename == '\0') {
    iVar2 = 0;
  }
  else {
    uVar1 = __oflag & 3;
    if (uVar1 == 2) {
      local_20[0] = 'a';
    }
    else if (uVar1 == 1) {
      local_20[0] = 'w';
    }
    else {
      local_20[0] = 'r';
    }
    local_20[1] = 0x74;
    if ((__oflag & 8U) == 0) {
      local_20[1] = 0x62;
    }
    uVar4 = 2;
    if (uVar1 == 3) {
      local_20[2] = 0x2b;
      uVar4 = 3;
    }
    uVar5 = uVar4;
    if ((__oflag & 4U) != 0) {
      uVar5 = (ulong)((int)uVar4 + 1);
      local_20[uVar4] = 'x';
    }
    local_20[uVar5] = '\0';
    pFVar3 = fopen(__filename,local_20);
    this->_file = (FILE *)pFVar3;
    if (*(int *)__file != 0) {
      b = *(char **)(__file + 8);
    }
    String::assign(&this->_path,b,*(int *)(__file + 4));
    iVar2 = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this->_file != (FILE *)0x0);
  }
  return iVar2;
}

Assistant:

bool File::open(const String& name, File::OpenMode mode)
{
	if(name == "")
		return false;
	CHART fopen_mode[8];
	int   i = 0;
	switch (mode & (READ | WRITE | APPEND | RW))
	{
	case WRITE:
		fopen_mode[i++] = STR_PREFIX('w');
		break;
	case APPEND:
		fopen_mode[i++] = STR_PREFIX('a');
		break;
	default:
		fopen_mode[i++] = STR_PREFIX('r');
		break;
	}

	fopen_mode[i++] = (mode & TEXT) ? STR_PREFIX('t') : STR_PREFIX('b');

	if ((mode & (READ | WRITE | APPEND | RW)) == RW)
		fopen_mode[i++] = STR_PREFIX('+');

#if !defined _MSC_VER || _MSC_VER >= 1900
	if (mode & CREATE)
		fopen_mode[i++] = STR_PREFIX('x');
#endif

	fopen_mode[i] = 0;

	_file = fopenX(name, fopen_mode);

	_path = name;

	return _file != 0;
}